

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<14,_7,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int i;
  Vec4 **ppVVar3;
  long lVar4;
  undefined4 *puVar5;
  long lVar6;
  Matrix<float,_4,_2> *mat;
  long lVar7;
  undefined4 uVar8;
  Vector<float,_3> res_2;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Type in0;
  float afStack_a8 [6];
  Vec4 *local_90;
  float local_88 [4];
  float local_78 [4];
  float local_68 [4];
  Vec4 *local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  Matrix<float,_4,_2> local_30;
  
  ppVVar3 = &local_58;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar4 != lVar7) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)ppVVar3 + lVar7) = uVar8;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 == 0x10);
      lVar6 = lVar6 + 1;
      ppVVar3 = (Vec4 **)((long)ppVVar3 + 4);
      lVar4 = lVar4 + 0x10;
    } while (lVar6 != 4);
    local_58 = *(Vec4 **)evalCtx->in[0].m_data;
    uStack_50 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    uVar2 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_48 = (undefined4)uVar1;
    uStack_44 = (undefined4)((ulong)uVar1 >> 0x20);
    uStack_40 = (undefined4)uVar2;
    uStack_3c = (undefined4)((ulong)uVar2 >> 0x20);
    mat = (Matrix<float,_4,_2> *)0x4;
  }
  else {
    local_48 = 0;
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    local_58 = (Vec4 *)0x0;
    uStack_50 = 0;
    puVar5 = &sr::(anonymous_namespace)::s_constInMat2x4;
    mat = (Matrix<float,_4,_2> *)0x0;
    do {
      lVar4 = 0;
      do {
        *(undefined4 *)((long)ppVVar3 + lVar4 * 4) = *(undefined4 *)((long)puVar5 + lVar4);
        lVar4 = lVar4 + 4;
      } while (lVar4 == 4);
      mat = (Matrix<float,_4,_2> *)((long)(mat->m_data).m_data[0].m_data + 1);
      ppVVar3 = (Vec4 **)((long)ppVVar3 + 4);
      puVar5 = puVar5 + 2;
    } while (mat != (Matrix<float,_4,_2> *)0x4);
  }
  local_30.m_data.m_data[0].m_data._0_8_ = local_58;
  local_30.m_data.m_data[0].m_data[2] = (float)uStack_50;
  local_90 = (Vec4 *)CONCAT44(uStack_40,uStack_44);
  local_88[0] = (float)uStack_3c;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  lVar4 = 0;
  do {
    local_68[lVar4] =
         local_30.m_data.m_data[0].m_data[lVar4] + *(float *)((long)&local_90 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  sr::(anonymous_namespace)::MatrixCaseUtils::decrement<float,4,2>
            (&local_30,(MatrixCaseUtils *)&local_58,mat);
  local_90 = (Vec4 *)local_30.m_data.m_data[0].m_data._0_8_;
  local_88[0] = local_30.m_data.m_data[0].m_data[2];
  afStack_a8[2] = local_30.m_data.m_data[1].m_data[1];
  afStack_a8[3] = local_30.m_data.m_data[1].m_data[2];
  afStack_a8[4] = local_30.m_data.m_data[1].m_data[3];
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  local_78[2] = 0.0;
  lVar4 = 0;
  do {
    local_78[lVar4] = *(float *)((long)&local_90 + lVar4 * 4) + afStack_a8[lVar4 + 2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  afStack_a8[2] = 0.0;
  afStack_a8[3] = 0.0;
  afStack_a8[4] = 0.0;
  lVar4 = 0;
  do {
    afStack_a8[lVar4 + 2] = local_68[lVar4] + local_78[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_90 = &evalCtx->color;
  local_88[0] = 0.0;
  local_88[1] = 1.4013e-45;
  local_88[2] = 2.8026e-45;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_90 + lVar4 * 4)] = afStack_a8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(in0) + reduceToVec3(decrement(in0));
	}